

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

uint32_t nghttp2_session_get_remote_settings(nghttp2_session *session,nghttp2_settings_id id)

{
  nghttp2_settings_id id_local;
  nghttp2_session *session_local;
  
  switch(id) {
  case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
    session_local._4_4_ = (session->remote_settings).header_table_size;
    break;
  case NGHTTP2_SETTINGS_ENABLE_PUSH:
    session_local._4_4_ = (session->remote_settings).enable_push;
    break;
  case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:
    session_local._4_4_ = (session->remote_settings).max_concurrent_streams;
    break;
  case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
    session_local._4_4_ = (session->remote_settings).initial_window_size;
    break;
  case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:
    session_local._4_4_ = (session->remote_settings).max_frame_size;
    break;
  case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:
    session_local._4_4_ = (session->remote_settings).max_header_list_size;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x1f47,
                  "uint32_t nghttp2_session_get_remote_settings(nghttp2_session *, nghttp2_settings_id)"
                 );
  case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:
    session_local._4_4_ = (session->remote_settings).enable_connect_protocol;
    break;
  case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:
    session_local._4_4_ = (session->remote_settings).no_rfc7540_priorities;
  }
  return session_local._4_4_;
}

Assistant:

uint32_t nghttp2_session_get_remote_settings(nghttp2_session *session,
                                             nghttp2_settings_id id) {
  switch (id) {
  case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
    return session->remote_settings.header_table_size;
  case NGHTTP2_SETTINGS_ENABLE_PUSH:
    return session->remote_settings.enable_push;
  case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:
    return session->remote_settings.max_concurrent_streams;
  case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
    return session->remote_settings.initial_window_size;
  case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:
    return session->remote_settings.max_frame_size;
  case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:
    return session->remote_settings.max_header_list_size;
  case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:
    return session->remote_settings.enable_connect_protocol;
  case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:
    return session->remote_settings.no_rfc7540_priorities;
  }

  assert(0);
  abort(); /* if NDEBUG is set */
}